

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

poptItem poptFreeItems(poptItem items,int nitems)

{
  char *pcVar1;
  char **ppcVar2;
  poptItem local_20;
  poptItem item;
  int nitems_local;
  poptItem items_local;
  
  local_20 = items;
  item._4_4_ = nitems;
  if (items != (poptItem)0x0) {
    while (item._4_4_ = item._4_4_ + -1, -1 < item._4_4_) {
      pcVar1 = (char *)_free((local_20->option).longName);
      (local_20->option).longName = pcVar1;
      pcVar1 = (char *)_free((local_20->option).descrip);
      (local_20->option).descrip = pcVar1;
      pcVar1 = (char *)_free((local_20->option).argDescrip);
      (local_20->option).argDescrip = pcVar1;
      ppcVar2 = (char **)_free(local_20->argv);
      local_20->argv = ppcVar2;
      local_20 = local_20 + 1;
    }
    _free(items);
  }
  return (poptItem)0x0;
}

Assistant:

static
poptItem poptFreeItems(poptItem items, int nitems)
{
    if (items != NULL) {
	poptItem item = items;
	while (--nitems >= 0) {
	    item->option.longName = _free(item->option.longName);
	    item->option.descrip = _free(item->option.descrip);
	    item->option.argDescrip = _free(item->option.argDescrip);
	    item->argv = _free(item->argv);
	    item++;
	}
	_free(items);
    }
    return NULL;
}